

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_float> * __thiscall
fmt::v10::make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,float>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_float>
           *__return_storage_ptr__,v10 *this,float *args)

{
  float *args_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_float> *local_38;
  bool formattable;
  bool formattable_pointer;
  bool formattable_char;
  
  local_38._0_4_ = (__return_storage_ptr__->data_).args_[0].field_0.int_value;
  return local_38;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}